

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::RunMemoryCheck(SystemInformationImplementation *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  FILE *__stream;
  uint uVar8;
  ulong *puVar9;
  long lVar10;
  undefined4 uStack_638;
  undefined2 uStack_634;
  undefined2 uStack_632;
  SystemInformationImplementation *pSStack_630;
  long lStack_628;
  ulong uStack_620;
  ulong uStack_618;
  ulong uStack_610;
  FILE *pFStack_608;
  long lStack_600;
  ulong uStack_5f8;
  long lStack_5f0;
  long lStack_5e8;
  long lStack_5e0;
  ulong uStack_5d8;
  ulong uStack_5d0;
  utsname uStack_5be;
  char acStack_438 [1032];
  
  uStack_610 = 0;
  uStack_618 = 0;
  uStack_620 = 0;
  lStack_628 = 0;
  iVar2 = uname(&uStack_5be);
  if (iVar2 == 0) {
    sVar7 = strlen(uStack_5be.release);
    bVar1 = false;
    uVar8 = 0;
    if (2 < sVar7) {
      uVar8 = 0;
      if ((int)uStack_5be.release[0] - 0x30U < 10) {
        uVar8 = (int)uStack_5be.release[0] - 0x30U;
      }
      bVar1 = '5' < uStack_5be.release[2] && (int)uStack_5be.release[2] - 0x30U < 10;
    }
    __stream = fopen("/proc/meminfo","r");
    if (__stream != (FILE *)0x0) {
      pSStack_630 = this;
      if ((2 < (int)uVar8) || ((bool)(uVar8 == 2 & bVar1))) {
        uStack_634 = 0;
        uStack_638 = 0;
        iVar2 = 0;
        pFStack_608 = __stream;
        while (__stream = pFStack_608, pcVar6 = fgets(acStack_438,0x400,pFStack_608),
              pcVar6 != (char *)0x0) {
          puVar9 = &uStack_5f8;
          pcVar6 = (char *)&uStack_638;
          for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 4) {
            if ((*pcVar6 == '\0') &&
               (iVar3 = __isoc99_sscanf(acStack_438,
                                        (long)&DAT_0077ac40 +
                                        (long)*(int *)((long)&DAT_0077ac40 + lVar10),puVar9),
               iVar3 == 1)) {
              *pcVar6 = '\x01';
              iVar2 = iVar2 + 1;
            }
            puVar9 = puVar9 + 1;
            pcVar6 = pcVar6 + 1;
          }
        }
        if (iVar2 == 6) {
          pSStack_630->TotalPhysicalMemory = uStack_5f8 >> 10;
          pSStack_630->AvailablePhysicalMemory = (ulong)(lStack_5e8 + lStack_5f0 + lStack_5e0) >> 10
          ;
          pSStack_630->TotalVirtualMemory = uStack_5d8 >> 10;
          pSStack_630->AvailableVirtualMemory = uStack_5d0 >> 10;
LAB_005418d6:
          fclose(__stream);
          return;
        }
      }
      else {
        pcVar6 = fgets(acStack_438,0x400,__stream);
        if (pcVar6 == acStack_438) {
          iVar2 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&uStack_618,&uStack_5f8,
                                  &lStack_628,&uStack_5f8,&lStack_600,&uStack_638);
          if (iVar2 == 6) {
            iVar2 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&uStack_610,&uStack_5f8,
                                    &uStack_620);
            iVar2 = iVar2 + 6;
          }
          if (iVar2 == 9) {
            pSStack_630->TotalVirtualMemory = uStack_610 >> 0x14;
            pSStack_630->TotalPhysicalMemory = uStack_618 >> 0x14;
            pSStack_630->AvailableVirtualMemory = uStack_620 >> 0x14;
            pSStack_630->AvailablePhysicalMemory =
                 (ulong)(lStack_600 + lStack_628 +
                        CONCAT26(uStack_632,CONCAT24(uStack_634,uStack_638))) >> 0x14;
            goto LAB_005418d6;
          }
        }
      }
      std::operator<<((ostream *)&std::cerr,"Problem parsing /proc/meminfo\n");
      fclose(__stream);
      return;
    }
    poVar4 = (ostream *)&std::cerr;
    pcVar6 = "Problem opening /proc/meminfo\n";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem calling uname(): ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    poVar4 = std::operator<<(poVar4,pcVar6);
    pcVar6 = "\n";
  }
  std::operator<<(poVar4,pcVar6);
  return;
}

Assistant:

void SystemInformationImplementation::RunMemoryCheck()
{
#if defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisMemory();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXMemory();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDMemory();
#elif defined(__CYGWIN__)
  this->QueryCygwinMemory();
#elif defined(_WIN32)
  this->QueryWindowsMemory();
#elif defined(__hpux)
  this->QueryHPUXMemory();
#elif defined(__linux)
  this->QueryLinuxMemory();
#elif defined(_AIX)
  this->QueryAIXMemory();
#else
  this->QueryMemory();
#endif
}